

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testSpecDowngradeFlexibleShapes(void)

{
  int iVar1;
  Rep *pRVar2;
  ulong uVar3;
  ArrayFeatureType_EnumeratedShapes *pAVar4;
  bool bVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  ArrayFeatureType_ShapeRange *pAVar8;
  SizeRange *obj;
  FeatureDescription *pFVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  UnaryFunctionLayerParams *pUVar13;
  Model *pMVar14;
  ostream *poVar15;
  undefined8 *puVar16;
  uint uVar17;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar18;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  Arena *pAVar19;
  Model m1;
  Model mlmodel;
  Result res;
  Model local_80;
  Model local_50;
  Result local_38;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  local_80.specificationversion_ = 3;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar2 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001a79f8:
    pRVar18 = &(local_80.description_)->input_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar1 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_001a79f8;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar2->elements[iVar1];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar16);
  if (*(long *)((long)pvVar12 + 0x20) == 0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar3 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  pAVar7->datatype_ = 0x10020;
  if (pAVar7->_oneof_case_[0] != 0x1f) {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar7);
    pAVar7->_oneof_case_[0] = 0x1f;
    uVar3 = (pAVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar8 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>(pAVar19);
    (pAVar7->ShapeFlexibility_).shaperange_ = pAVar8;
  }
  pAVar4 = (pAVar7->ShapeFlexibility_).enumeratedshapes_;
  pRVar2 = (pAVar4->shapes_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001a7aeb:
    obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SizeRange>
                    ((pAVar4->shapes_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pAVar4->shapes_).super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar1 = (pAVar4->shapes_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_001a7aeb;
    (pAVar4->shapes_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar2->elements[iVar1];
  }
  *(undefined8 *)((long)pvVar12 + 0x10) = 10;
  *(undefined8 *)((long)pvVar12 + 0x18) = 10;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar19);
  }
  pRVar2 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001a7b58:
    pRVar18 = &(local_80.description_)->output_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar18->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar18->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar1 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_001a7b58;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar2->elements[iVar1];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"probs",puVar16);
  if (*(long *)((long)pvVar12 + 0x20) == 0) {
    pAVar19 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar19);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar3 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pAVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar19);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  ((pFVar6->Type_).multiarraytype_)->datatype_ = 0x10040;
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar19 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar19);
  }
  pRVar2 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001a7c55:
    this = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
           &(local_80.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this,pNVar10);
  }
  else {
    iVar1 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_001a7c55;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar2->elements[iVar1];
  }
  pRVar2 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001a7c8d:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar1 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar1) goto LAB_001a7c8d;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar12 = pRVar2->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3cb973);
  pRVar2 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar12 = pRVar2->elements[iVar1];
      goto LAB_001a7cf7;
    }
  }
  pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
LAB_001a7cf7:
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3b872d);
  if (pNVar10->_oneof_case_[0] != 0xdc) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0xdc;
    uVar3 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar19 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar19 = *(Arena **)pAVar19;
    }
    pUVar13 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::UnaryFunctionLayerParams>(pAVar19);
    (pNVar10->layer_).unary_ = pUVar13;
  }
  (((pNVar10->layer_).convolution_)->kernelsize_).current_size_ = 6;
  CoreML::validate<(MLModelType)500>(&local_38,&local_80);
  bVar5 = CoreML::Result::good(&local_38);
  if (bVar5) {
    CoreML::Model::Model(&local_50,&local_80);
    pMVar14 = CoreML::Model::getProto(&local_50);
    bVar5 = pMVar14->specificationversion_ != 3;
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1050);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,
                 "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12",
                 0x50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
    }
    uVar17 = (uint)bVar5;
    CoreML::Model::~Model(&local_50);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x104c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    uVar17 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return uVar17;
}

Assistant:

int testSpecDowngradeFlexibleShapes() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *array_type = topIn->mutable_type()->mutable_multiarraytype();
    array_type->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *array_shape1_range = array_type->mutable_shaperange()->add_sizeranges();
    array_shape1_range->set_lowerbound(10);
    array_shape1_range->set_upperbound(10);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");

    auto *params = layer->mutable_unary();
    params->set_type(Specification::UnaryFunctionLayerParams::ABS);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12);

    return 0;

}